

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O1

bool __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_false>::AtQuantifier
          (Parser<NullTerminatedUnicodeEncodingPolicy,_false> *this)

{
  EncodedChar *pEVar1;
  code *pcVar2;
  int iVar3;
  CharCount n;
  bool bVar4;
  EncodedChar EVar5;
  undefined4 *puVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  
  if (this->inputLim < this->next) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar4) goto LAB_00ebdbe7;
    *puVar6 = 0;
  }
  EVar5 = *this->next;
  if ((ushort)EVar5 - 0x2a < 2) {
    return true;
  }
  if (EVar5 == L'?') {
    return true;
  }
  if (EVar5 == L'{') {
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    uVar8 = 1;
    while( true ) {
      uVar9 = uVar8;
      iVar3 = (int)uVar9;
      uVar8 = (ulong)(iVar3 + 1);
      if (this->inputLim < this->next + uVar8) break;
      if (this->inputLim < this->next + uVar9) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar4) goto LAB_00ebdbe7;
        *puVar6 = 0;
      }
      if ((0xff < (ulong)(ushort)this->next[uVar9]) ||
         ((ASCIIChars::classes[(ushort)this->next[uVar9]] & 0x10) == 0)) break;
    }
    if (iVar3 != 1) {
      if (this->next + uVar8 <= this->inputLim) {
        if (this->inputLim < this->next + uVar9) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar6 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
          if (!bVar4) {
LAB_00ebdbe7:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar6 = 0;
        }
        EVar5 = this->next[uVar9];
        if (EVar5 == L'}') {
          return true;
        }
        if (EVar5 == L',') {
          if ((this->next + (iVar3 + 2) <= this->inputLim) &&
             (EVar5 = ECLookahead(this,iVar3 + 1U), EVar5 == L'}')) {
            return true;
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          uVar8 = (ulong)(iVar3 + 1U);
          iVar3 = 0;
          while( true ) {
            iVar7 = iVar3;
            n = (CharCount)uVar8;
            uVar9 = (ulong)(n + 1);
            if (this->inputLim < this->next + uVar9) break;
            if (this->inputLim < this->next + uVar8) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar6 = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                 ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
              if (!bVar4) goto LAB_00ebdbe7;
              *puVar6 = 0;
            }
            pEVar1 = this->next + uVar8;
            if ((0xff < (ulong)(ushort)*pEVar1) ||
               (uVar8 = uVar9, iVar3 = iVar7 + -1,
               (ASCIIChars::classes[(ushort)*pEVar1] & 0x10) == 0)) break;
          }
          if ((iVar7 != 0) && (this->next + uVar9 <= this->inputLim)) {
            EVar5 = ECLookahead(this,n);
            return EVar5 == L'}';
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool Parser<P, IsLiteral>::AtQuantifier()
    {
        // Could be terminating 0
        switch (ECLookahead())
        {
        case '*':
        case '+':
        case '?':
            return true;
        case '{':
            {
                CharCount lookahead = 1;
                while (ECCanConsume(lookahead + 1) && standardEncodedChars->IsDigit(ECLookahead(lookahead)))
                    lookahead++;
                if (lookahead == 1 || !ECCanConsume(lookahead + 1))
                    return false;
                switch (ECLookahead(lookahead))
                {
                case ',':
                    lookahead++;
                    if (ECCanConsume(lookahead + 1) && ECLookahead(lookahead) == '}')
                        return true;
                    else
                    {
                        CharCount saved = lookahead;
                        while (ECCanConsume(lookahead + 1) && standardEncodedChars->IsDigit(ECLookahead(lookahead)))
                            lookahead++;
                        if (lookahead == saved)
                            return false;
                        return ECCanConsume(lookahead + 1) && ECLookahead(lookahead) == '}';
                    }
                case '}':
                    return true;
                default:
                    return false;
                }
            }
        default:
            return false;
        }
    }